

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_xop
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  Option *in_stack_00000508;
  int in_stack_00000510;
  int in_stack_00000514;
  Mat *in_stack_00000518;
  Mat *in_stack_00000520;
  
  conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse
            (in_stack_00000520,in_stack_00000518,in_stack_00000514,in_stack_00000510,
             in_stack_00000508);
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_xop(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(kernel, kernel_tm, inch, outch, opt);
}